

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

int lj_tab_next(GCtab *t,cTValue *key,TValue *o)

{
  uint64_t *puVar1;
  Node *n;
  cTValue *a;
  uint32_t idx;
  TValue *o_local;
  cTValue *key_local;
  GCtab *t_local;
  
  for (a._4_4_ = lj_tab_keyindex(t,key); a._4_4_ < t->asize; a._4_4_ = a._4_4_ + 1) {
    puVar1 = (uint64_t *)((t->array).ptr64 + (ulong)a._4_4_ * 8);
    if (*puVar1 != 0xffffffffffffffff) {
      o->n = (double)(int)a._4_4_;
      o[1].u64 = *puVar1;
      return 1;
    }
  }
  a._4_4_ = a._4_4_ - t->asize;
  while( true ) {
    if (t->hmask < a._4_4_) {
      t_local._0_4_ = 0;
      if ((int)a._4_4_ < 0) {
        t_local._0_4_ = -1;
      }
      return (int)t_local;
    }
    puVar1 = (uint64_t *)((t->node).ptr64 + (ulong)a._4_4_ * 0x18);
    if (*puVar1 != 0xffffffffffffffff) break;
    a._4_4_ = a._4_4_ + 1;
  }
  *o = *(TValue *)(puVar1 + 1);
  o[1].u64 = *puVar1;
  return 1;
}

Assistant:

int lj_tab_next(GCtab *t, cTValue *key, TValue *o)
{
  uint32_t idx = lj_tab_keyindex(t, key);  /* Find successor index of key. */
  /* First traverse the array part. */
  for (; idx < t->asize; idx++) {
    cTValue *a = arrayslot(t, idx);
    if (LJ_LIKELY(!tvisnil(a))) {
      setintV(o, idx);
      o[1] = *a;
      return 1;
    }
  }
  idx -= t->asize;
  /* Then traverse the hash part. */
  for (; idx <= t->hmask; idx++) {
    Node *n = &noderef(t->node)[idx];
    if (!tvisnil(&n->val)) {
      o[0] = n->key;
      o[1] = n->val;
      return 1;
    }
  }
  return (int32_t)idx < 0 ? -1 : 0;  /* Invalid key or end of traversal. */
}